

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ssize_t __thiscall
duckdb_parquet::BloomFilterCompression::read
          (BloomFilterCompression *this,int __fd,void *__buf,size_t __nbytes)

{
  uint32_t uVar1;
  uint uVar2;
  ssize_t sVar3;
  short *__nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  int16_t fid;
  TType ftype;
  string fname;
  uint32_t xfer;
  TInputRecursionTracker tracker;
  undefined4 in_stack_ffffffffffffff78;
  TType in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff84;
  uint32_t in_stack_ffffffffffffff88;
  uint32_t in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  uint32_t in_stack_ffffffffffffff94;
  short local_46;
  int local_44;
  string local_40 [36];
  uint local_1c;
  undefined8 local_10;
  BloomFilterCompression *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  duckdb_apache::thrift::protocol::TInputRecursionTracker::TInputRecursionTracker
            ((TInputRecursionTracker *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
             ,(TProtocol *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_1c = 0;
  std::__cxx11::string::string(local_40);
  uVar1 = duckdb_apache::thrift::protocol::TProtocol::readStructBegin
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (string *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_1c = uVar1 + local_1c;
  while( true ) {
    __nbytes_00 = &local_46;
    in_stack_ffffffffffffff94 =
         duckdb_apache::thrift::protocol::TProtocol::readFieldBegin
                   ((TProtocol *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (string *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                    (TType *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                    (int16_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    local_1c = in_stack_ffffffffffffff94 + local_1c;
    if (local_44 == 0) break;
    if (local_46 == 1) {
      if (local_44 == 0xc) {
        sVar3 = Uncompressed::read(&this->UNCOMPRESSED,(int)local_10,__buf_00,(size_t)__nbytes_00);
        in_stack_ffffffffffffff90 = (int)sVar3;
        local_1c = in_stack_ffffffffffffff90 + local_1c;
        this->__isset = (_BloomFilterCompression__isset)((byte)this->__isset & 0xfe | 1);
      }
      else {
        in_stack_ffffffffffffff8c =
             duckdb_apache::thrift::protocol::TProtocol::skip
                       ((TProtocol *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff7c);
        local_1c = in_stack_ffffffffffffff8c + local_1c;
      }
    }
    else {
      in_stack_ffffffffffffff88 =
           duckdb_apache::thrift::protocol::TProtocol::skip
                     ((TProtocol *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      in_stack_ffffffffffffff7c);
      local_1c = in_stack_ffffffffffffff88 + local_1c;
    }
    in_stack_ffffffffffffff84 =
         duckdb_apache::thrift::protocol::TProtocol::readFieldEnd((TProtocol *)0x224c680);
    local_1c = in_stack_ffffffffffffff84 + local_1c;
  }
  uVar1 = duckdb_apache::thrift::protocol::TProtocol::readStructEnd((TProtocol *)0x224c6a1);
  uVar2 = uVar1 + local_1c;
  local_1c = uVar2;
  std::__cxx11::string::~string(local_40);
  duckdb_apache::thrift::protocol::TInputRecursionTracker::~TInputRecursionTracker
            ((TInputRecursionTracker *)0x224c6cf);
  return (ulong)uVar2;
}

Assistant:

uint32_t BloomFilterCompression::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->UNCOMPRESSED.read(iprot);
          this->__isset.UNCOMPRESSED = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}